

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall absl::lts_20250127::log_internal::LogMessage::LogBacktraceIfNeeded(LogMessage *this)

{
  LogMessageData *pLVar1;
  bool bVar2;
  int max_num_frames;
  OstreamView view;
  
  bVar2 = IsInitialized();
  if (bVar2) {
    pLVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    bVar2 = ShouldLogBacktraceAt((pLVar1->entry).base_filename_,(pLVar1->entry).line_);
    if (bVar2) {
      OstreamView::OstreamView
                (&view,(this->data_)._M_t.
                       super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                       .
                       super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                       ._M_head_impl);
      std::operator<<(&(view.data_)->manipulated," (stacktrace:\n");
      max_num_frames = MaxFramesInLogStackTrace();
      bVar2 = ShouldSymbolizeLogStackTrace();
      debugging_internal::DumpStackTrace
                (1,max_num_frames,bVar2,anon_unknown_4::WriteToStream,&(view.data_)->manipulated);
      std::operator<<(&(view.data_)->manipulated,") ");
      OstreamView::~OstreamView(&view);
    }
  }
  return;
}

Assistant:

void LogMessage::LogBacktraceIfNeeded() {
  if (!absl::log_internal::IsInitialized()) return;

  if (!absl::log_internal::ShouldLogBacktraceAt(data_->entry.source_basename(),
                                                data_->entry.source_line()))
    return;
  OstreamView view(*data_);
  view.stream() << " (stacktrace:\n";
  debugging_internal::DumpStackTrace(
      1, log_internal::MaxFramesInLogStackTrace(),
      log_internal::ShouldSymbolizeLogStackTrace(), WriteToStream,
      &view.stream());
  view.stream() << ") ";
}